

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack16.h
# Opt level: O3

void ncnn::conv3x3s1_winograd23_pack16_avx512
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Mat *bias,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  size_t sVar5;
  int *piVar6;
  void *pvVar7;
  undefined1 auVar8 [16];
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  bool bVar13;
  uint uVar14;
  int iVar15;
  int _h;
  int iVar16;
  int iVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  ulong uVar21;
  undefined1 (*pauVar22) [64];
  Mat *dst;
  uint uVar23;
  undefined1 (*pauVar24) [64];
  undefined1 (*pauVar25) [64];
  int iVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  ulong uVar30;
  bool bVar31;
  ulong uVar32;
  Option *opt_00;
  ulong uVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  int _w;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  long local_670;
  ulong local_668;
  undefined1 local_660 [16];
  Mat local_5f0;
  Option *local_5a0;
  Mat *local_598;
  Mat local_590;
  Mat *local_548;
  size_t local_540;
  Mat *local_538;
  undefined1 local_530 [64];
  size_t local_4f0;
  undefined1 local_4e0 [64];
  size_t local_4a0;
  undefined1 local_490 [16];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [256];
  undefined1 auStack_280 [256];
  undefined1 auStack_180 [256];
  undefined1 auStack_80 [80];
  
  iVar16 = bottom_blob->c;
  sVar5 = bottom_blob->elemsize;
  iVar17 = bottom_blob->elempack;
  uVar1 = top_blob->w;
  uVar3 = top_blob->h;
  auVar34._4_4_ = uVar3;
  auVar34._0_4_ = uVar1;
  iVar26 = top_blob->c;
  piVar6 = bottom_blob->refcount;
  local_590.data = bottom_blob->data;
  local_590.refcount._0_4_ = SUB84(bottom_blob->refcount,0);
  local_590.refcount._4_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  local_590.allocator = bottom_blob->allocator;
  iVar19 = bottom_blob->h;
  iVar15 = bottom_blob->w;
  auVar8._0_4_ = bottom_blob->dims;
  auVar8._4_4_ = bottom_blob->w;
  auVar8._8_4_ = bottom_blob->h;
  auVar8._12_4_ = bottom_blob->d;
  local_590.cstep = bottom_blob->cstep;
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + 1;
    UNLOCK();
    iVar15 = bottom_blob->w;
    iVar19 = bottom_blob->h;
  }
  auVar40 = vpcmpeqd_avx(auVar8,auVar8);
  auVar34._8_8_ = 0;
  auVar34 = vpsubd_avx(auVar34,auVar40);
  auVar40 = vpsrld_avx(auVar34,0x1f);
  local_660 = vpaddd_avx(auVar34,auVar40);
  auVar40._8_4_ = 0xfffffffe;
  auVar40._0_8_ = 0xfffffffefffffffe;
  auVar40._12_4_ = 0xfffffffe;
  local_490 = vpandd_avx512vl(local_660,auVar40);
  _w = local_490._0_4_;
  _h = local_490._4_4_;
  local_590.elemsize = sVar5;
  local_590.elempack = iVar17;
  local_590.dims = auVar8._0_4_;
  local_590.w = auVar8._4_4_;
  local_590.h = auVar8._8_4_;
  local_590.d = auVar8._12_4_;
  local_590.c = iVar16;
  local_548 = bias;
  local_538 = kernel_tm;
  copy_make_border(bottom_blob,&local_590,0,(_h - iVar19) + 2,0,(_w - iVar15) + 2,0,0.0,opt);
  auVar34 = vpsrad_avx512vl(local_660,1);
  local_4f0 = 0;
  auVar8 = vpshufd_avx(auVar34,0x55);
  auVar8 = vpmulld_avx(auVar8,auVar34);
  local_530._0_8_ = (void *)0x0;
  local_530._8_4_ = 0;
  local_530._12_4_ = 0;
  local_530._16_8_ = 0;
  local_530._24_4_ = 0;
  local_530._32_8_ = (Allocator *)0x0;
  local_530._40_4_ = 0;
  local_530._44_4_ = 0;
  local_530._48_12_ = SUB1612((undefined1  [16])0x0,4);
  local_5a0 = opt;
  local_598 = top_blob;
  local_540 = sVar5;
  Mat::create((Mat *)local_530,auVar8._0_4_,0x10,iVar16,sVar5,iVar17,opt->workspace_allocator);
  sVar5 = local_540;
  dst = local_598;
  opt_00 = local_5a0;
  if (0 < (long)local_590.c) {
    uVar23 = (local_590.h - (local_590.h + -2 >> 0x1f)) + -2 >> 1;
    uVar14 = (local_590.w - (local_590.w + -2 >> 0x1f)) + -2 >> 1;
    iVar16 = uVar14 * uVar23;
    uVar33 = 1;
    if (1 < (int)uVar14) {
      uVar33 = (ulong)uVar14;
    }
    if ((int)uVar23 < 2) {
      uVar23 = 1;
    }
    local_670 = 0;
    do {
      if (3 < local_590.h) {
        local_660._0_8_ =
             (long)local_590.data + local_590.elemsize * local_590.cstep * local_670 + 0xc0;
        lVar29 = local_530._16_8_ * local_4f0 * local_670;
        lVar18 = 0;
        uVar32 = 0;
        do {
          if (3 < local_590.w) {
            uVar21 = 0;
            lVar20 = lVar18;
            pauVar22 = (undefined1 (*) [64])local_660._0_8_;
            do {
              lVar28 = -0x100;
              pauVar24 = pauVar22;
              do {
                auVar38 = pauVar24[-2];
                auVar37 = pauVar24[-1];
                auVar35 = vsubps_avx512f(pauVar24[-3],auVar37);
                auVar36 = vaddps_avx512f(auVar37,auVar38);
                auVar37 = vsubps_avx512f(auVar37,auVar38);
                auVar38 = vsubps_avx512f(*pauVar24,auVar38);
                *(undefined1 (*) [64])(local_380 + lVar28) = auVar35;
                *(undefined1 (*) [64])(auStack_280 + lVar28) = auVar36;
                *(undefined1 (*) [64])(auStack_180 + lVar28) = auVar37;
                *(undefined1 (*) [64])(auStack_80 + lVar28) = auVar38;
                pauVar24 = (undefined1 (*) [64])(*pauVar24 + (long)(local_590.w << 4) * 4);
                lVar28 = lVar28 + 0x40;
              } while (lVar28 != 0);
              lVar27 = 0;
              lVar28 = lVar20;
              do {
                auVar38 = *(undefined1 (*) [64])(local_440 + lVar27);
                auVar37 = *(undefined1 (*) [64])(local_400 + lVar27);
                auVar35 = vsubps_avx512f(*(undefined1 (*) [64])(local_480 + lVar27),auVar37);
                auVar36 = vaddps_avx512f(auVar37,auVar38);
                auVar37 = vsubps_avx512f(auVar37,auVar38);
                auVar38 = vsubps_avx512f(*(undefined1 (*) [64])(local_3c0 + lVar27),auVar38);
                *(undefined1 (*) [64])(local_530._0_8_ + lVar28 + lVar29) = auVar35;
                *(undefined1 (*) [64])
                 (local_530._0_8_ + lVar28 + (long)(iVar16 * 0x10) * 4 + lVar29) = auVar36;
                *(undefined1 (*) [64])
                 (local_530._0_8_ + lVar28 + (long)(iVar16 * 0x20) * 4 + lVar29) = auVar37;
                *(undefined1 (*) [64])
                 (local_530._0_8_ + lVar28 + (long)(iVar16 * 0x30) * 4 + lVar29) = auVar38;
                lVar27 = lVar27 + 0x100;
                lVar28 = lVar28 + (long)(iVar16 * 0x40) * 4;
              } while (lVar27 != 0x400);
              uVar21 = uVar21 + 1;
              pauVar22 = pauVar22 + 2;
              lVar20 = lVar20 + 0x40;
            } while (uVar21 != uVar33);
          }
          uVar32 = uVar32 + 1;
          local_660._0_8_ =
               (undefined1 *)local_660._0_8_ + (long)local_590.w * local_590.elemsize * 2;
          lVar18 = lVar18 + (long)(int)uVar14 * 0x40;
        } while (uVar32 != uVar23);
      }
      local_670 = local_670 + 1;
    } while (local_670 != local_590.c);
  }
  piVar6 = (int *)CONCAT44(local_590.refcount._4_4_,local_590.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_590.allocator == (Allocator *)0x0) {
        if (local_590.data != (void *)0x0) {
          free(local_590.data);
        }
      }
      else {
        (*(local_590.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_590.cstep = 0;
  local_590.data = (void *)0x0;
  local_590.refcount._0_4_ = 0;
  local_590.refcount._4_4_ = 0;
  local_590.elemsize = 0;
  local_590.elempack = 0;
  local_590.h = 0;
  local_590.d = 0;
  local_590.c = 0;
  local_590.allocator = (Allocator *)0x0;
  local_590.dims = 0;
  local_590.w = 0;
  local_4a0 = 0;
  local_4e0._0_8_ = (void *)0x0;
  local_4e0._8_4_ = 0;
  local_4e0._12_4_ = 0;
  local_4e0._16_8_ = 0;
  local_4e0._24_4_ = 0;
  local_4e0._32_8_ = (Allocator *)0x0;
  local_4e0._40_4_ = 0;
  local_4e0._44_4_ = 0;
  local_4e0._48_12_ = SUB1612((undefined1  [16])0x0,4);
  convolution_winograd_dot_pack16_avx512((Mat *)local_530,iVar26,local_538,(Mat *)local_4e0,opt_00);
  local_5f0.cstep = 0;
  local_5f0.data = (void *)0x0;
  local_5f0.refcount._0_4_ = 0;
  local_5f0.refcount._4_4_ = 0;
  local_5f0.elemsize = 0;
  local_5f0.elempack = 0;
  local_5f0.allocator = (Allocator *)0x0;
  local_5f0.dims = 0;
  local_5f0.w = 0;
  local_5f0.h = 0;
  local_5f0.d = 0;
  local_5f0.c = 0;
  uVar2 = dst->w;
  uVar4 = dst->h;
  auVar39._4_4_ = uVar4;
  auVar39._0_4_ = uVar2;
  auVar39._8_8_ = 0;
  uVar33 = vpcmpd_avx512vl(auVar39,local_490,4);
  if ((uVar33 & 3) == 0) {
    if (&local_5f0 == dst) {
      iVar26 = 0;
      iVar19 = 0;
      goto LAB_001dc31b;
    }
    piVar6 = dst->refcount;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + 1;
      UNLOCK();
    }
    local_5f0.data = dst->data;
    local_5f0.refcount._0_4_ = SUB84(dst->refcount,0);
    local_5f0.refcount._4_4_ = (undefined4)((ulong)dst->refcount >> 0x20);
    local_5f0.elemsize = dst->elemsize;
    local_5f0.elempack = dst->elempack;
    local_5f0.allocator = dst->allocator;
    uVar9 = dst->dims;
    uVar10 = dst->w;
    uVar11 = dst->h;
    uVar12 = dst->d;
    local_5f0.c = dst->c;
    local_5f0.cstep = dst->cstep;
    iVar16 = dst->w;
    iVar17 = dst->h;
    local_5f0.dims = uVar9;
    local_5f0.w = uVar10;
    local_5f0.h = uVar11;
    local_5f0.d = uVar12;
  }
  else {
    Mat::create(&local_5f0,_w,_h,iVar26,sVar5,iVar17,opt_00->workspace_allocator);
    iVar16 = local_5f0.w;
    iVar17 = local_5f0.h;
  }
  iVar26 = iVar16;
  iVar19 = iVar17;
  if (0 < local_5f0.c) {
    pvVar7 = local_548->data;
    uVar23 = iVar16 / 2;
    iVar15 = uVar23 * (iVar17 / 2);
    uVar33 = 0;
    do {
      if (pvVar7 == (void *)0x0) {
        auVar38 = ZEXT1664((undefined1  [16])0x0);
      }
      else {
        auVar38 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)pvVar7 + uVar33 * 0x40));
      }
      if (1 < iVar17) {
        local_660._0_8_ =
             (long)local_5f0.data + local_5f0.elemsize * local_5f0.cstep * uVar33 + 0x40;
        local_668 = 0;
        uVar32 = 0;
        do {
          if (1 < iVar16) {
            uVar30 = 0;
            uVar21 = local_668;
            pauVar22 = (undefined1 (*) [64])local_660._0_8_;
            do {
              pauVar24 = (undefined1 (*) [64])
                         (local_4e0._0_8_ +
                         (uVar21 >> 4 & 0xfffffff) * 0x40 + local_4e0._16_8_ * local_4a0 * uVar33);
              lVar18 = 0x100;
              do {
                auVar37 = vaddps_avx512f(*(undefined1 (*) [64])
                                          (*pauVar24 + (long)(iVar15 * 0x10) * 4),*pauVar24);
                auVar37 = vaddps_avx512f(auVar37,*(undefined1 (*) [64])
                                                  (*pauVar24 + (long)(iVar15 * 0x20) * 4));
                auVar35 = vsubps_avx512f(*(undefined1 (*) [64])
                                          (*pauVar24 + (long)(iVar15 * 0x10) * 4),
                                         *(undefined1 (*) [64])
                                          (*pauVar24 + (long)(iVar15 * 0x20) * 4));
                auVar35 = vaddps_avx512f(auVar35,*(undefined1 (*) [64])
                                                  (*pauVar24 + (long)(iVar15 * 0x30) * 4));
                *(undefined1 (*) [64])((long)&local_590.elemsize + lVar18) = auVar37;
                *(undefined1 (*) [64])(local_480 + lVar18) = auVar35;
                lVar18 = lVar18 + 0x40;
                pauVar24 = (undefined1 (*) [64])(*pauVar24 + (long)(iVar15 * 0x40) * 4);
              } while (lVar18 != 0x200);
              pauVar24 = &local_480;
              pauVar25 = pauVar22;
              bVar13 = true;
              do {
                bVar31 = bVar13;
                auVar37 = vaddps_avx512f(auVar38,pauVar24[1]);
                auVar35 = vaddps_avx512f(auVar37,*pauVar24);
                auVar35 = vaddps_avx512f(auVar35,pauVar24[2]);
                auVar37 = vsubps_avx512f(auVar37,pauVar24[2]);
                auVar37 = vaddps_avx512f(auVar37,pauVar24[3]);
                pauVar25[-1] = auVar35;
                *pauVar25 = auVar37;
                pauVar25 = (undefined1 (*) [64])(*pauVar25 + (long)(iVar16 << 4) * 4);
                pauVar24 = (undefined1 (*) [64])local_380;
                bVar13 = false;
              } while (bVar31);
              uVar30 = uVar30 + 1;
              uVar21 = uVar21 + 0x10;
              pauVar22 = pauVar22 + 2;
            } while (uVar30 != uVar23);
          }
          uVar32 = uVar32 + 1;
          local_668 = local_668 + (ulong)uVar23 * 0x10;
          local_660._0_8_ =
               (undefined1 *)local_660._0_8_ + (long)local_5f0.w * local_5f0.elemsize * 2;
        } while (uVar32 != (uint)(iVar17 / 2));
      }
      uVar33 = uVar33 + 1;
      dst = local_598;
      opt_00 = local_5a0;
      iVar26 = local_5f0.w;
      iVar19 = local_5f0.h;
    } while (uVar33 != (uint)local_5f0.c);
  }
LAB_001dc31b:
  copy_cut_border(&local_5f0,dst,0,iVar19 - dst->h,0,iVar26 - dst->w,opt_00);
  piVar6 = (int *)CONCAT44(local_5f0.refcount._4_4_,local_5f0.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_5f0.allocator == (Allocator *)0x0) {
        if (local_5f0.data != (void *)0x0) {
          free(local_5f0.data);
        }
      }
      else {
        (*(local_5f0.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar6 = (int *)CONCAT44(local_4e0._12_4_,local_4e0._8_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if ((Allocator *)local_4e0._32_8_ == (Allocator *)0x0) {
        if ((void *)local_4e0._0_8_ != (void *)0x0) {
          free((void *)local_4e0._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_4e0._32_8_)[3])();
      }
    }
  }
  piVar6 = (int *)CONCAT44(local_530._12_4_,local_530._8_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if ((Allocator *)local_530._32_8_ == (Allocator *)0x0) {
        if ((void *)local_530._0_8_ != (void *)0x0) {
          free((void *)local_530._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_530._32_8_)[3])();
      }
    }
  }
  piVar6 = (int *)CONCAT44(local_590.refcount._4_4_,local_590.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_590.allocator == (Allocator *)0x0) {
        if (local_590.data != (void *)0x0) {
          free(local_590.data);
        }
      }
      else {
        (*(local_590.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd23_pack16_avx512(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Mat& bias, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    // pad to 2n+2
    Mat bottom_blob_bordered = bottom_blob;

    outw = (outw + 1) / 2 * 2;
    outh = (outh + 1) / 2 * 2;

    w = outw + 2;
    h = outh + 2;
    copy_make_border(bottom_blob, bottom_blob_bordered, 0, h - bottom_blob.h, 0, w - bottom_blob.w, BORDER_CONSTANT, 0.f, opt);

    // BEGIN transform input
    Mat bottom_blob_tm;
    {
        int w_tiles = outw / 2;
        int h_tiles = outh / 2;
        int tiles = w_tiles * h_tiles;

        bottom_blob_tm.create(tiles, 16, inch, elemsize, elempack, opt.workspace_allocator);
        conv3x3s1_winograd23_transform_input_pack16_avx512(bottom_blob_bordered, bottom_blob_tm, opt);
    }
    bottom_blob_bordered = Mat();
    // END transform input

    // BEGIN dot
    Mat top_blob_tm;
    convolution_winograd_dot_pack16_avx512(bottom_blob_tm, outch, kernel_tm, top_blob_tm, opt);
    // END dot

    // BEGIN transform output
    Mat top_blob_bordered;
    if (outw == top_blob.w && outh == top_blob.h)
    {
        top_blob_bordered = top_blob;
    }
    else
    {
        top_blob_bordered.create(outw, outh, outch, elemsize, elempack, opt.workspace_allocator);
    }
    {
        conv3x3s1_winograd23_transform_output_pack16_avx512(top_blob_tm, top_blob_bordered, bias, opt);
    }
    // END transform output

    // cut result pad
    copy_cut_border(top_blob_bordered, top_blob, 0, top_blob_bordered.h - top_blob.h, 0, top_blob_bordered.w - top_blob.w, opt);
}